

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite_command.cpp
# Opt level: O1

int main(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long *plVar1;
  long lVar2;
  pointer psVar3;
  pointer psVar4;
  initializer_list<std::shared_ptr<ICommand>_> __l;
  BankAccount ba;
  CommandList commands;
  allocator_type local_71;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  shared_ptr<ICommand> local_68;
  undefined8 *local_58;
  undefined8 *local_50;
  undefined **local_48;
  vector<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_> local_40;
  
  local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xfffffe0c000003e8;
  local_68.super___shared_ptr<ICommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  (local_68.super___shared_ptr<ICommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_68.super___shared_ptr<ICommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_68.super___shared_ptr<ICommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00104cc8;
  local_68.super___shared_ptr<ICommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_68.super___shared_ptr<ICommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  local_68.super___shared_ptr<ICommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__ICommand_00104d78;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> ***)
   &local_68.super___shared_ptr<ICommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = &local_70;
  local_68.super___shared_ptr<ICommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x6400000000;
  local_50 = (undefined8 *)operator_new(0x28);
  local_50[1] = 0x100000001;
  *local_50 = &PTR___Sp_counted_ptr_inplace_00104cc8;
  local_58 = local_50 + 2;
  local_50[2] = &PTR__ICommand_00104d78;
  local_50[3] = &local_70;
  local_50[4] = 0xc800000001;
  __l._M_len = 2;
  __l._M_array = &local_68;
  std::vector<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>::vector
            (&local_40,__l,&local_71);
  local_48 = &PTR__CommandList_00104c18;
  lVar2 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_70 + lVar2) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_70 + lVar2));
    }
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != 0);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)local_70);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  psVar4 = local_40.
           super__Vector_base<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = local_40.
                super__Vector_base<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar4; psVar3 = psVar3 + 1) {
    (*((psVar3->super___shared_ptr<ICommand,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_ICommand[2]
    )();
  }
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)local_70);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  for (psVar4 = local_40.
                super__Vector_base<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      psVar4 != local_40.
                super__Vector_base<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 = psVar4 + -1) {
    (*(psVar4[-1].super___shared_ptr<ICommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ICommand
      [3])();
  }
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)local_70);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::vector<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>::~vector
            (&local_40);
  return 0;
}

Assistant:

int main()
{
	BankAccount ba{1000};
	CommandList commands{
		std::make_shared<Command>(ba, Command::Action::Deposit, 100),
		std::make_shared<Command>(ba, Command::Action::Withdraw, 200),
	};

	std::cout << ba.balance << std::endl;
	commands.invoke();
	std::cout << ba.balance << std::endl;
	commands.undo();
	std::cout << ba.balance << std::endl;

	return 0;
}